

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O2

void __thiscall Pl_Base64::flush_encode(Pl_Base64 *this)

{
  byte bVar1;
  size_t sVar2;
  Pipeline *pPVar3;
  undefined4 in_EAX;
  size_t i;
  long lVar4;
  size_t sVar5;
  byte bVar6;
  undefined5 uStack_8;
  uchar out [4];
  
  uStack_8 = CONCAT14((byte)*(int *)this->buf >> 2,in_EAX);
  _uStack_8 = CONCAT17(this->buf[2],
                       CONCAT16((char)(CONCAT11(this->buf[1],this->buf[2]) >> 6),
                                CONCAT15((char)(((uint)this->buf[1] << 8 | *(int *)this->buf << 0x10
                                                ) >> 0xc),uStack_8))) & 0x3f3f3fffffffffff;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    bVar1 = out[lVar4];
    if (bVar1 < 0x1a) {
      bVar6 = bVar1 + 0x41;
    }
    else if (bVar1 < 0x34) {
      bVar6 = bVar1 + 0x47;
    }
    else if (bVar1 < 0x3e) {
      bVar6 = bVar1 - 4;
    }
    else {
      bVar6 = 0x2b;
      if ((bVar1 != 0x3e) && (bVar6 = bVar1, bVar1 == 0x3f)) {
        bVar6 = 0x2f;
      }
    }
    out[lVar4] = bVar6;
  }
  sVar2 = this->pos;
  for (sVar5 = 3; sVar2 != sVar5; sVar5 = sVar5 - 1) {
    out[sVar5] = '=';
  }
  pPVar3 = (this->super_Pipeline).next_;
  (*pPVar3->_vptr_Pipeline[2])(pPVar3,out,4);
  return;
}

Assistant:

void
Pl_Base64::flush_encode()
{
    int outval = ((this->buf[0] << 16) | (this->buf[1] << 8) | (this->buf[2]));
    unsigned char out[4] = {
        to_uc(outval >> 18),
        to_uc(0x3f & (outval >> 12)),
        to_uc(0x3f & (outval >> 6)),
        to_uc(0x3f & outval),
    };
    for (size_t i = 0; i < 4; ++i) {
        int ch = to_i(out[i]);
        if (ch < 26) {
            ch += 'A';
        } else if (ch < 52) {
            ch -= 26;
            ch += 'a';
        } else if (ch < 62) {
            ch -= 52;
            ch += '0';
        } else if (ch == 62) {
            ch = '+';
        } else if (ch == 63) {
            ch = '/';
        }
        out[i] = to_uc(ch);
    }
    for (size_t i = 0; i < 3 - this->pos; ++i) {
        out[3 - i] = '=';
    }
    next()->write(out, 4);
}